

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O2

void __thiscall Assimp::D3MF::D3MFExporter::writeBuild(D3MFExporter *this)

{
  ostringstream *poVar1;
  ostream *poVar2;
  long lVar3;
  
  poVar1 = &this->mModelOutput;
  poVar2 = std::operator<<((ostream *)poVar1,"<");
  poVar2 = std::operator<<(poVar2,(string *)XmlTag::build_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,">");
  std::endl<char,std::char_traits<char>>(poVar2);
  for (lVar3 = 1;
      lVar3 - 1U <
      (ulong)((long)(this->mBuildItems).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->mBuildItems).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2); lVar3 = lVar3 + 1) {
    poVar2 = std::operator<<((ostream *)poVar1,"<");
    poVar2 = std::operator<<(poVar2,(string *)XmlTag::item_abi_cxx11_);
    poVar2 = std::operator<<(poVar2," objectid=\"");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\"/>");
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
  }
  poVar2 = std::operator<<((ostream *)poVar1,"</");
  poVar2 = std::operator<<(poVar2,(string *)XmlTag::build_abi_cxx11_);
  std::operator<<(poVar2,">");
  std::endl<char,std::char_traits<char>>((ostream *)poVar1);
  return;
}

Assistant:

void D3MFExporter::writeBuild() {
    mModelOutput << "<" << XmlTag::build << ">" << std::endl;

    for ( size_t i = 0; i < mBuildItems.size(); ++i ) {
        mModelOutput << "<" << XmlTag::item << " objectid=\"" << i + 1 << "\"/>";
        mModelOutput << std::endl;
    }
    mModelOutput << "</" << XmlTag::build << ">";
    mModelOutput << std::endl;
}